

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip,mz_uint file_index)

{
  mz_zip_internal_state *pmVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = 0;
  if ((((pZip == (mz_zip_archive *)0x0) ||
       (pmVar1 = pZip->m_pState, pmVar1 == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    lVar3 = 0;
  }
  else {
    lVar3 = (ulong)*(uint *)((long)(pmVar1->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
            (long)(pmVar1->m_central_dir).m_p;
  }
  if (lVar3 != 0) {
    uVar2 = *(byte *)(lVar3 + 8) & 1;
  }
  return uVar2;
}

Assistant:

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip,
                                        mz_uint file_index) {
  mz_uint m_bit_flag;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if (!p)
    return MZ_FALSE;
  m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  return (m_bit_flag & 1);
}